

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O1

void * FilterRender::doColor
                 (void *data,uint width,uint height,u_int8_t r,u_int8_t g,u_int8_t b,u_int8_t a)

{
  byte *pbVar1;
  ulong uVar2;
  int i;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int i_3;
  double dVar9;
  double dVar10;
  
  uVar2 = (ulong)width;
  uVar8 = (ulong)height;
  pvVar3 = operator_new__(uVar8 * 8);
  if (height != 0) {
    uVar5 = 0;
    do {
      pvVar4 = operator_new__(uVar2 * 8);
      *(void **)((long)pvVar3 + uVar5 * 8) = pvVar4;
      if (width != 0) {
        uVar6 = 0;
        do {
          pvVar4 = operator_new__(4);
          *(void **)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8) = pvVar4;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
    uVar5 = 0;
    pvVar4 = data;
    do {
      if (width != 0) {
        uVar6 = 0;
        do {
          lVar7 = 0;
          do {
            *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8) + lVar7) =
                 *(undefined1 *)((long)pvVar4 + lVar7);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          pvVar4 = (void *)((long)pvVar4 + 4);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar2);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
    uVar5 = 0;
    do {
      if (width != 0) {
        uVar6 = 0;
        do {
          pbVar1 = *(byte **)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8);
          dVar9 = ((double)pbVar1[2] + (double)pbVar1[1] + (double)*pbVar1) /
                  (double)((uint)g + (uint)r + (uint)b);
          dVar10 = dVar9 * (double)b;
          if (255.0 <= dVar10) {
            dVar10 = 255.0;
          }
          *pbVar1 = (byte)(int)dVar10;
          dVar10 = dVar9 * (double)g;
          if (255.0 <= dVar10) {
            dVar10 = 255.0;
          }
          *(char *)(*(long *)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8) + 1) =
               (char)(int)dVar10;
          dVar9 = dVar9 * (double)r;
          if (255.0 <= dVar9) {
            dVar9 = 255.0;
          }
          *(char *)(*(long *)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8) + 2) =
               (char)(int)dVar9;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
    uVar5 = 0;
    do {
      if (width != 0) {
        uVar6 = 0;
        do {
          lVar7 = 0;
          do {
            *(undefined1 *)((long)data + lVar7) =
                 *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8) + lVar7)
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          data = (void *)((long)data + 4);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar2);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
    uVar5 = 0;
    do {
      if (width != 0) {
        uVar6 = 0;
        do {
          pvVar4 = *(void **)(*(long *)((long)pvVar3 + uVar5 * 8) + uVar6 * 8);
          if (pvVar4 != (void *)0x0) {
            operator_delete__(pvVar4);
          }
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      pvVar4 = *(void **)((long)pvVar3 + uVar5 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
  }
  operator_delete__(pvVar3);
}

Assistant:

void* FilterRender::doColor(void *data, uint width, uint height, u_int8_t r, u_int8_t g, u_int8_t b, u_int8_t a) {
	//std::cerr << "fuckyou" << std::endl;
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			double nw_sum = (1.*map[i][j][0] + map[i][j][1] + map[i][j][2])/(r+g+b);
				map[i][j][0] = std::min(255., nw_sum*b);
				map[i][j][1] = std::min(255., nw_sum*g);
				map[i][j][2] = std::min(255., nw_sum*r);
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}